

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

char * __thiscall
sentencepiece::SentencePieceText::_InternalParse
          (SentencePieceText *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  string *s;
  SentencePieceText_SentencePiece *msg;
  uint uVar4;
  Rep *pRVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  int iVar7;
  void *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *pfVar9;
  char cVar10;
  uint res;
  uint uVar11;
  pair<const_char_*,_unsigned_int> pVar12;
  float *local_50;
  InternalMetadata *local_48;
  ExtensionSet *local_40;
  ArenaStringPtr *local_38;
  
  local_50 = (float *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
  uVar11 = 0;
  if (!bVar3) {
    local_48 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->text_;
    local_40 = &this->_extensions_;
    uVar11 = 0;
    uVar6 = extraout_RDX;
    do {
      bVar1 = *(byte *)local_50;
      res = (uint)bVar1;
      pfVar9 = (float *)((long)local_50 + 1);
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*(byte *)pfVar9 * 0x80) - 0x80;
        if (-1 < (char)*(byte *)pfVar9) {
          pfVar9 = (float *)((long)local_50 + 2);
          goto LAB_001e2670;
        }
        pVar12 = google::protobuf::internal::ReadTagFallback((char *)local_50,res);
        local_50 = (float *)pVar12.first;
        if (local_50 != (float *)0x0) {
          res = pVar12.second;
          goto LAB_001e2675;
        }
LAB_001e286b:
        local_50 = (float *)0x0;
        break;
      }
LAB_001e2670:
      pVar12._8_8_ = uVar6;
      pVar12.first = (char *)pfVar9;
      local_50 = pfVar9;
LAB_001e2675:
      pfVar9 = (float *)pVar12.first;
      uVar4 = res >> 3;
      cVar10 = (char)res;
      if (uVar4 == 3) {
        if (cVar10 != '\x1d') goto LAB_001e2799;
        uVar11 = 2;
        this->score_ = *pfVar9;
        local_50 = pfVar9 + 1;
      }
      else {
        if (uVar4 == 2) {
          if (cVar10 == '\x12') {
            local_50 = (float *)((long)pfVar9 + -1);
            do {
              local_50 = (float *)((long)local_50 + 1);
              pRVar5 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar5 == (Rep *)0x0) {
                iVar7 = (this->pieces_).super_RepeatedPtrFieldBase.total_size_;
LAB_001e26ee:
                google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                          (&(this->pieces_).super_RepeatedPtrFieldBase,iVar7 + 1);
                pRVar5 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
                iVar7 = pRVar5->allocated_size;
LAB_001e26fe:
                pRVar5->allocated_size = iVar7 + 1;
                msg = google::protobuf::Arena::
                      CreateMaybeMessage<sentencepiece::SentencePieceText_SentencePiece>
                                ((this->pieces_).super_RepeatedPtrFieldBase.arena_);
                pRVar5 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
                iVar7 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
                (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
                pRVar5->elements[iVar7] = msg;
              }
              else {
                iVar2 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
                iVar7 = pRVar5->allocated_size;
                if (iVar7 <= iVar2) {
                  if (iVar7 == (this->pieces_).super_RepeatedPtrFieldBase.total_size_)
                  goto LAB_001e26ee;
                  goto LAB_001e26fe;
                }
                (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                msg = (SentencePieceText_SentencePiece *)pRVar5->elements[iVar2];
              }
              local_50 = (float *)google::protobuf::internal::ParseContext::
                                  ParseMessage<sentencepiece::SentencePieceText_SentencePiece>
                                            (ctx,msg,(char *)local_50);
              if (local_50 == (float *)0x0) goto LAB_001e286b;
            } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                    (*(byte *)local_50 == 0x12));
            goto LAB_001e2823;
          }
LAB_001e2799:
          if ((res == 0) || ((res & 7) == 4)) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
            break;
          }
          if (res < 0x640) {
            if (((ulong)local_48->ptr_ & 1) == 0) {
              unknown = google::protobuf::internal::InternalMetadata::
                        mutable_unknown_fields_slow<std::__cxx11::string>(local_48);
              pfVar9 = local_50;
            }
            else {
              unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (((ulong)local_48->ptr_ & 0xfffffffffffffffe) + 8);
            }
            local_50 = (float *)google::protobuf::internal::UnknownFieldParse
                                          (res,unknown,(char *)pfVar9,ctx);
          }
          else {
            local_50 = (float *)google::protobuf::internal::ExtensionSet::ParseField
                                          (local_40,(ulong)res,(char *)pfVar9,
                                           (MessageLite *)_SentencePieceText_default_instance_,
                                           local_48,ctx);
          }
        }
        else {
          if ((uVar4 != 1) || (cVar10 != '\n')) goto LAB_001e2799;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pvVar8 = (this->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pvVar8 & 1) != 0) {
            pvVar8 = *(void **)((ulong)pvVar8 & 0xfffffffffffffffe);
          }
          s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,pvVar8);
          local_50 = (float *)google::protobuf::internal::InlineGreedyStringParser
                                        (s,(char *)local_50,ctx);
        }
        if (local_50 == (float *)0x0) goto LAB_001e286b;
      }
LAB_001e2823:
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
      uVar6 = extraout_RDX_00;
    } while (!bVar3);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar11;
  return (char *)local_50;
}

Assistant:

const char* SentencePieceText::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string text = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_text();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .sentencepiece.SentencePieceText.SentencePiece pieces = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_pieces(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional float score = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 29)) {
          _Internal::set_has_score(&has_bits);
          score_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}